

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O2

int lws_socket_bind(lws_vhost *vhost,lws_sockfd_type sockfd,int port,char *iface,int ipv6_allowed)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint *puVar4;
  int *piVar5;
  char *pcVar6;
  socklen_t len;
  sockaddr_in local_b8;
  sockaddr_storage sin;
  
  len = 0x80;
  sin.__ss_padding[0x6e] = '\0';
  sin.__ss_padding[0x6f] = '\0';
  sin.__ss_padding[0x70] = '\0';
  sin.__ss_padding[0x71] = '\0';
  sin.__ss_padding[0x72] = '\0';
  sin.__ss_padding[0x73] = '\0';
  sin.__ss_padding[0x74] = '\0';
  sin.__ss_padding[0x75] = '\0';
  sin.__ss_align = 0;
  sin.__ss_padding[0x5e] = '\0';
  sin.__ss_padding[0x5f] = '\0';
  sin.__ss_padding[0x60] = '\0';
  sin.__ss_padding[0x61] = '\0';
  sin.__ss_padding[0x62] = '\0';
  sin.__ss_padding[99] = '\0';
  sin.__ss_padding[100] = '\0';
  sin.__ss_padding[0x65] = '\0';
  sin.__ss_padding[0x66] = '\0';
  sin.__ss_padding[0x67] = '\0';
  sin.__ss_padding[0x68] = '\0';
  sin.__ss_padding[0x69] = '\0';
  sin.__ss_padding[0x6a] = '\0';
  sin.__ss_padding[0x6b] = '\0';
  sin.__ss_padding[0x6c] = '\0';
  sin.__ss_padding[0x6d] = '\0';
  sin.__ss_padding[0x4e] = '\0';
  sin.__ss_padding[0x4f] = '\0';
  sin.__ss_padding[0x50] = '\0';
  sin.__ss_padding[0x51] = '\0';
  sin.__ss_padding[0x52] = '\0';
  sin.__ss_padding[0x53] = '\0';
  sin.__ss_padding[0x54] = '\0';
  sin.__ss_padding[0x55] = '\0';
  sin.__ss_padding[0x56] = '\0';
  sin.__ss_padding[0x57] = '\0';
  sin.__ss_padding[0x58] = '\0';
  sin.__ss_padding[0x59] = '\0';
  sin.__ss_padding[0x5a] = '\0';
  sin.__ss_padding[0x5b] = '\0';
  sin.__ss_padding[0x5c] = '\0';
  sin.__ss_padding[0x5d] = '\0';
  sin.__ss_padding[0x3e] = '\0';
  sin.__ss_padding[0x3f] = '\0';
  sin.__ss_padding[0x40] = '\0';
  sin.__ss_padding[0x41] = '\0';
  sin.__ss_padding[0x42] = '\0';
  sin.__ss_padding[0x43] = '\0';
  sin.__ss_padding[0x44] = '\0';
  sin.__ss_padding[0x45] = '\0';
  sin.__ss_padding[0x46] = '\0';
  sin.__ss_padding[0x47] = '\0';
  sin.__ss_padding[0x48] = '\0';
  sin.__ss_padding[0x49] = '\0';
  sin.__ss_padding[0x4a] = '\0';
  sin.__ss_padding[0x4b] = '\0';
  sin.__ss_padding[0x4c] = '\0';
  sin.__ss_padding[0x4d] = '\0';
  sin.__ss_padding[0x2e] = '\0';
  sin.__ss_padding[0x2f] = '\0';
  sin.__ss_padding[0x30] = '\0';
  sin.__ss_padding[0x31] = '\0';
  sin.__ss_padding[0x32] = '\0';
  sin.__ss_padding[0x33] = '\0';
  sin.__ss_padding[0x34] = '\0';
  sin.__ss_padding[0x35] = '\0';
  sin.__ss_padding[0x36] = '\0';
  sin.__ss_padding[0x37] = '\0';
  sin.__ss_padding[0x38] = '\0';
  sin.__ss_padding[0x39] = '\0';
  sin.__ss_padding[0x3a] = '\0';
  sin.__ss_padding[0x3b] = '\0';
  sin.__ss_padding[0x3c] = '\0';
  sin.__ss_padding[0x3d] = '\0';
  sin.__ss_padding[0x1e] = '\0';
  sin.__ss_padding[0x1f] = '\0';
  sin.__ss_padding[0x20] = '\0';
  sin.__ss_padding[0x21] = '\0';
  sin.__ss_padding[0x22] = '\0';
  sin.__ss_padding[0x23] = '\0';
  sin.__ss_padding[0x24] = '\0';
  sin.__ss_padding[0x25] = '\0';
  sin.__ss_padding[0x26] = '\0';
  sin.__ss_padding[0x27] = '\0';
  sin.__ss_padding[0x28] = '\0';
  sin.__ss_padding[0x29] = '\0';
  sin.__ss_padding[0x2a] = '\0';
  sin.__ss_padding[0x2b] = '\0';
  sin.__ss_padding[0x2c] = '\0';
  sin.__ss_padding[0x2d] = '\0';
  sin.__ss_padding[0xe] = '\0';
  sin.__ss_padding[0xf] = '\0';
  sin.__ss_padding[0x10] = '\0';
  sin.__ss_padding[0x11] = '\0';
  sin.__ss_padding[0x12] = '\0';
  sin.__ss_padding[0x13] = '\0';
  sin.__ss_padding[0x14] = '\0';
  sin.__ss_padding[0x15] = '\0';
  sin.__ss_padding[0x16] = '\0';
  sin.__ss_padding[0x17] = '\0';
  sin.__ss_padding[0x18] = '\0';
  sin.__ss_padding[0x19] = '\0';
  sin.__ss_padding[0x1a] = '\0';
  sin.__ss_padding[0x1b] = '\0';
  sin.__ss_padding[0x1c] = '\0';
  sin.__ss_padding[0x1d] = '\0';
  sin.ss_family = 0;
  sin.__ss_padding[0] = '\0';
  sin.__ss_padding[1] = '\0';
  sin.__ss_padding[2] = '\0';
  sin.__ss_padding[3] = '\0';
  sin.__ss_padding[4] = '\0';
  sin.__ss_padding[5] = '\0';
  sin.__ss_padding[6] = '\0';
  sin.__ss_padding[7] = '\0';
  sin.__ss_padding[8] = '\0';
  sin.__ss_padding[9] = '\0';
  sin.__ss_padding[10] = '\0';
  sin.__ss_padding[0xb] = '\0';
  sin.__ss_padding[0xc] = '\0';
  sin.__ss_padding[0xd] = '\0';
  local_b8.sin_zero[0] = '\0';
  local_b8.sin_zero[1] = '\0';
  local_b8.sin_zero[2] = '\0';
  local_b8.sin_zero[3] = '\0';
  local_b8.sin_zero[4] = '\0';
  local_b8.sin_zero[5] = '\0';
  local_b8.sin_zero[6] = '\0';
  local_b8.sin_zero[7] = '\0';
  local_b8.sin_family = 2;
  local_b8.sin_port = 0;
  local_b8.sin_addr.s_addr = 0;
  if (iface != (char *)0x0) {
    iVar2 = lws_interface_to_sa(0,iface,&local_b8,0x10);
    if (iVar2 == -1) {
      _lws_log(8,"%s: netif %s: Does not exist\n","lws_socket_bind",iface);
      return -1;
    }
    if (iVar2 == -2) {
      _lws_log(8,"%s: netif %s: Not usable\n","lws_socket_bind",iface);
      return -2;
    }
  }
  local_b8.sin_port = (ushort)port << 8 | (ushort)port >> 8;
  if (sockfd == -1) {
    port = 0;
  }
  else {
    uVar3 = bind(sockfd,(sockaddr *)&local_b8,0x10);
    if ((int)uVar3 < 0) {
      puVar4 = (uint *)__errno_location();
      uVar1 = *puVar4;
      _lws_log(1,"ERROR on binding fd %d to port %d (%d %d)\n",sockfd,(ulong)(uint)port,(ulong)uVar3
               ,(ulong)uVar1);
      port = -(uint)(uVar1 != 0x62) | 0xfffffffd;
    }
    else {
      iVar2 = getsockname(sockfd,(sockaddr *)&sin,&len);
      if (iVar2 == -1) {
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        _lws_log(2,"getsockname: %s\n",pcVar6);
      }
      else {
        port = (int)(ushort)(sin.__ss_padding._0_2_ << 8 | (ushort)sin.__ss_padding._0_2_ >> 8);
      }
    }
  }
  return port;
}

Assistant:

int
lws_socket_bind(struct lws_vhost *vhost, lws_sockfd_type sockfd, int port,
		const char *iface, int ipv6_allowed)
{
#ifdef LWS_WITH_UNIX_SOCK
	struct sockaddr_un serv_unix;
#endif
#ifdef LWS_WITH_IPV6
	struct sockaddr_in6 serv_addr6;
#endif
	struct sockaddr_in serv_addr4;
#ifndef LWS_PLAT_OPTEE
	socklen_t len = sizeof(struct sockaddr_storage);
#endif
	int n;
#if !defined(LWS_PLAT_FREERTOS) && !defined(LWS_PLAT_OPTEE)
	int m;
#endif
	struct sockaddr_storage sin;
	struct sockaddr *v;

	memset(&sin, 0, sizeof(sin));

#if defined(LWS_WITH_UNIX_SOCK)
	if (!port && LWS_UNIX_SOCK_ENABLED(vhost)) {
		v = (struct sockaddr *)&serv_unix;
		n = sizeof(struct sockaddr_un);
		memset(&serv_unix, 0, sizeof(serv_unix));
		serv_unix.sun_family = AF_UNIX;
		if (!iface)
			return LWS_ITOSA_NOT_EXIST;
		if (sizeof(serv_unix.sun_path) <= strlen(iface)) {
			lwsl_err("\"%s\" too long for UNIX domain socket\n",
			         iface);
			return LWS_ITOSA_NOT_EXIST;
		}
		strcpy(serv_unix.sun_path, iface);
		if (serv_unix.sun_path[0] == '@')
			serv_unix.sun_path[0] = '\0';
		else
			unlink(serv_unix.sun_path);

	} else
#endif
#if defined(LWS_WITH_IPV6) && !defined(LWS_PLAT_FREERTOS)
	if (ipv6_allowed && LWS_IPV6_ENABLED(vhost)) {
		v = (struct sockaddr *)&serv_addr6;
		n = sizeof(struct sockaddr_in6);
		memset(&serv_addr6, 0, sizeof(serv_addr6));
		if (iface) {
			m = interface_to_sa(vhost, iface,
				    (struct sockaddr_in *)v, n, 1);
			if (m == LWS_ITOSA_NOT_USABLE) {
				lwsl_info("%s: netif %s: Not usable\n",
					 __func__, iface);
				return m;
			}
			if (m == LWS_ITOSA_NOT_EXIST) {
				lwsl_info("%s: netif %s: Does not exist\n",
					 __func__, iface);
				return m;
			}
			serv_addr6.sin6_scope_id = lws_get_addr_scope(iface);
		}

		serv_addr6.sin6_family = AF_INET6;
		serv_addr6.sin6_port = htons(port);
	} else
#endif
	{
		v = (struct sockaddr *)&serv_addr4;
		n = sizeof(serv_addr4);
		memset(&serv_addr4, 0, sizeof(serv_addr4));
		serv_addr4.sin_addr.s_addr = INADDR_ANY;
		serv_addr4.sin_family = AF_INET;

#if !defined(LWS_PLAT_FREERTOS) && !defined(LWS_PLAT_OPTEE)
		if (iface) {
		    m = interface_to_sa(vhost, iface,
				    (struct sockaddr_in *)v, n, 0);
			if (m == LWS_ITOSA_NOT_USABLE) {
				lwsl_info("%s: netif %s: Not usable\n",
					 __func__, iface);
				return m;
			}
			if (m == LWS_ITOSA_NOT_EXIST) {
				lwsl_info("%s: netif %s: Does not exist\n",
					 __func__, iface);
				return m;
			}
		}
#endif
		serv_addr4.sin_port = htons(port);
	} /* ipv4 */

	/* just checking for the interface extant */
	if (sockfd == LWS_SOCK_INVALID)
		return LWS_ITOSA_USABLE;

	n = bind(sockfd, v, n);
#ifdef LWS_WITH_UNIX_SOCK
	if (n < 0 && LWS_UNIX_SOCK_ENABLED(vhost)) {
		lwsl_err("ERROR on binding fd %d to \"%s\" (%d %d)\n",
			 sockfd, iface, n, LWS_ERRNO);
		return LWS_ITOSA_NOT_EXIST;
	} else
#endif
	if (n < 0) {
		int _lws_errno = LWS_ERRNO;

		lwsl_err("ERROR on binding fd %d to port %d (%d %d)\n",
			 sockfd, port, n, _lws_errno);

		/* if something already listening, tell caller to fail permanently */

		if (_lws_errno == LWS_EADDRINUSE)
			return LWS_ITOSA_BUSY;

		/* otherwise ask caller to retry later */

		return LWS_ITOSA_NOT_EXIST;
	}

#if defined(LWS_WITH_UNIX_SOCK)
	if (LWS_UNIX_SOCK_ENABLED(vhost)) {
		uid_t uid = vhost->context->uid;
		gid_t gid = vhost->context->gid;

		if (vhost->unix_socket_perms) {
			if (lws_plat_user_colon_group_to_ids(
				vhost->unix_socket_perms, &uid, &gid)) {
				lwsl_err("%s: Failed to translate %s\n",
					  __func__, vhost->unix_socket_perms);
				return LWS_ITOSA_NOT_EXIST;
			}
		}
		if (uid && gid) {
			if (chown(serv_unix.sun_path, uid, gid)) {
				lwsl_err("%s: failed to set %s perms %u:%u\n",
					 __func__, serv_unix.sun_path,
					 (unsigned int)uid, (unsigned int)gid);

				return LWS_ITOSA_NOT_EXIST;
			}
			lwsl_notice("%s: vh %s unix skt %s perms %u:%u\n",
				    __func__, vhost->name, serv_unix.sun_path,
				    (unsigned int)uid, (unsigned int)gid);

			if (chmod(serv_unix.sun_path, 0660)) {
				lwsl_err("%s: failed to set %s to 0600 mode\n",
					 __func__, serv_unix.sun_path);

				return LWS_ITOSA_NOT_EXIST;
			}
		}
	}
#endif

#ifndef LWS_PLAT_OPTEE
	if (getsockname(sockfd, (struct sockaddr *)&sin, &len) == -1)
		lwsl_warn("getsockname: %s\n", strerror(LWS_ERRNO));
	else
#endif
#if defined(LWS_WITH_IPV6)
		port = (sin.ss_family == AF_INET6) ?
			ntohs(((struct sockaddr_in6 *) &sin)->sin6_port) :
			ntohs(((struct sockaddr_in *) &sin)->sin_port);
#else
		{
			struct sockaddr_in sain;
			memcpy(&sain, &sin, sizeof(sain));
			port = ntohs(sain.sin_port);
		}
#endif

	return port;
}